

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_execresult(lua_State *L,int stat)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  char *s;
  
  if (stat != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
    if ((stat & 0x7fU) != 0) {
      iVar1 = (stat & 0x7fU) * 0x1000000;
      iVar3 = iVar1 + 0x1000000;
      if (0x1ffffff < iVar3) {
        stat = stat & 0x7fU;
      }
      s = "exit";
      if (SBORROW4(iVar3,0x2000000) == iVar1 + -0x1000000 < 0) {
        s = "signal";
      }
      goto LAB_0011596a;
    }
  }
  stat = (uint)stat >> 8 & 0xff;
  s = "exit";
LAB_0011596a:
  if ((stat == 0) && (*s == 'e')) {
    lua_pushboolean(L,1);
  }
  else {
    lua_pushnil(L);
  }
  lua_pushstring(L,s);
  lua_pushinteger(L,(long)stat);
  return 3;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  if (stat != 0 && errno != 0)  /* error with an 'errno'? */
    return luaL_fileresult(L, 0, NULL);
  else {
    const char *what = "exit";  /* type of termination */
    l_inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      luaL_pushfail(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/fail,what,code */
  }
}